

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3_result_error_code(sqlite3_context *pCtx,int errCode)

{
  ulong uVar1;
  char *z;
  
  pCtx->isError = -(uint)(errCode == 0) | errCode;
  if ((pCtx->pOut->flags & 1) == 0) {
    return;
  }
  if (errCode == 0x204) {
    z = "abort due to ROLLBACK";
  }
  else if (errCode == 0x65) {
    z = "no more rows available";
  }
  else if (errCode == 100) {
    z = "another row available";
  }
  else {
    uVar1 = (ulong)(uint)errCode & 0xff;
    z = "unknown error";
    if (((uint)uVar1 < 0x1d) && ((0x1410004UL >> ((ulong)(uint)errCode & 0x3f) & 1) == 0)) {
      z = *(char **)(sqlite3ErrStr_aMsg + uVar1 * 8);
    }
  }
  sqlite3VdbeMemSetStr(pCtx->pOut,z,-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_code(sqlite3_context *pCtx, int errCode){
  pCtx->isError = errCode ? errCode : -1;
#ifdef SQLITE_DEBUG
  if( pCtx->pVdbe ) pCtx->pVdbe->rcApp = errCode;
#endif
  if( pCtx->pOut->flags & MEM_Null ){
    sqlite3VdbeMemSetStr(pCtx->pOut, sqlite3ErrStr(errCode), -1, 
                         SQLITE_UTF8, SQLITE_STATIC);
  }
}